

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O3

void __thiscall TC_parser<false>::maybeFeature(TC_parser<false> *this)

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  example *peVar4;
  features *pfVar5;
  unsigned_long *_begin;
  bool bVar6;
  substring s;
  uint uVar7;
  uint64_t uVar8;
  feature_index i;
  uint64_t uVar9;
  pointer ppvVar10;
  features **ppfVar11;
  float *pfVar12;
  long lVar13;
  byte *pbVar14;
  float *_begin_00;
  uint uVar15;
  uint uVar16;
  byte *pbVar17;
  uint uVar18;
  size_t dict;
  ulong uVar19;
  char *c;
  byte *pbVar20;
  float fVar21;
  substring sVar22;
  substring sVar23;
  substring feature_name;
  char local_49;
  byte *local_48;
  substring local_40;
  
  pbVar20 = (byte *)this->reading_head;
  bVar2 = *pbVar20;
  if (bVar2 == 9) {
    return;
  }
  if (bVar2 == 0x20) {
    return;
  }
  if (bVar2 == 0x7c) {
    return;
  }
  if (bVar2 == 0xd || pbVar20 == (byte *)this->endLine) {
    return;
  }
  lVar13 = 0;
  while( true ) {
    pbVar1 = pbVar20 + lVar13;
    if ((((bVar2 < 0x3b) && ((0x400000100000200U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
        (bVar2 == 0x7c)) || ((pbVar1 == (byte *)this->endLine || (bVar2 == 0xd)))) break;
    this->reading_head = (char *)(pbVar20 + lVar13 + 1);
    bVar2 = pbVar20[lVar13 + 1];
    lVar13 = lVar13 + 1;
  }
  local_48 = (byte *)CONCAT44(local_48._4_4_,this->cur_channel_v);
  local_40.begin = (char *)pbVar20;
  local_40.end = (char *)pbVar1;
  fVar21 = featureValue(this);
  fVar21 = fVar21 * local_48._0_4_;
  this->v = fVar21;
  if (lVar13 == 0) {
    sVar3 = this->anon;
    this->anon = sVar3 + 1;
    i = sVar3 + this->channel_hash;
  }
  else {
    sVar22.end = (char *)pbVar1;
    sVar22.begin = (char *)pbVar20;
    uVar8 = (*this->p->hasher)(sVar22,this->channel_hash);
    i = uVar8 & this->parse_mask;
    fVar21 = this->v;
  }
  if ((fVar21 == 0.0) && (!NAN(fVar21))) {
    return;
  }
  features::push_back((this->ae->super_example_predict).feature_space + this->index,fVar21,i);
  uVar19 = (ulong)this->index;
  uVar8 = this->affix_features[uVar19];
  if (uVar8 != 0 && lVar13 != 0) {
    peVar4 = this->ae;
    if ((peVar4->super_example_predict).feature_space[0x84].values._end ==
        (peVar4->super_example_predict).feature_space[0x84].values._begin) {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar4,&affix_namespace);
      uVar19 = (ulong)this->index;
      uVar8 = this->affix_features[uVar19];
      if (uVar8 == 0) goto LAB_00274c7a;
    }
    local_48 = pbVar20 + lVar13;
    do {
      uVar19 = (ulong)((uint)(uVar8 >> 1) & 7);
      pbVar14 = pbVar1;
      pbVar17 = pbVar20;
      if ((pbVar20 + uVar19 < pbVar1) && (pbVar14 = pbVar20 + uVar19, (uVar8 & 1) == 0)) {
        pbVar17 = local_48 + -uVar19;
        pbVar14 = pbVar1;
      }
      sVar23.end = (char *)pbVar14;
      sVar23.begin = (char *)pbVar17;
      uVar9 = (*this->p->hasher)(sVar23,this->channel_hash);
      features::push_back((peVar4->super_example_predict).feature_space + 0x84,this->v,
                          ((ulong)((uint)uVar8 & 0xf) * 0x1aa5cfd + 0xd42855) * uVar9);
      bVar6 = 0xf < uVar8;
      uVar8 = uVar8 >> 4;
    } while (bVar6);
    uVar19 = (ulong)this->index;
  }
LAB_00274c7a:
  if (this->spelling_features[uVar19] == true) {
    peVar4 = this->ae;
    if ((peVar4->super_example_predict).feature_space[0x85].values._end ==
        (peVar4->super_example_predict).feature_space[0x85].values._begin) {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar4,&spelling_namespace);
    }
    v_array<char>::clear(&this->spelling);
    if (lVar13 != 0) {
      do {
        bVar2 = *pbVar20;
        if ((byte)(bVar2 - 0x30) < 10) {
          local_49 = '0';
        }
        else if ((byte)(bVar2 + 0x9f) < 0x1a) {
          local_49 = 'a';
        }
        else if ((byte)(bVar2 + 0xbf) < 0x1a) {
          local_49 = 'A';
        }
        else if (bVar2 == 0x2e) {
          local_49 = '.';
        }
        else {
          local_49 = '#';
        }
        v_array<char>::push_back(&this->spelling,&local_49);
        pbVar20 = pbVar20 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    s.begin = (this->spelling)._begin;
    s.end = (this->spelling)._end;
    uVar8 = hashstring(s,this->channel_hash);
    features::push_back((peVar4->super_example_predict).feature_space + 0x85,this->v,uVar8);
    uVar19 = (ulong)this->index;
  }
  ppvVar10 = this->namespace_dictionaries[uVar19].
             super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (this->namespace_dictionaries[uVar19].
      super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppvVar10) {
    uVar19 = 0;
    do {
      uVar7 = (int)local_40.end - (int)local_40.begin;
      uVar15 = uVar7;
      if ((int)uVar7 < 0) {
        uVar15 = uVar7 + 3;
      }
      pbVar20 = (byte *)(local_40.begin + (int)(uVar15 & 0xfffffffc));
      uVar18 = 0x1aa5cfd;
      if (6 < uVar7 + 3) {
        lVar13 = (long)-((int)uVar15 >> 2);
        do {
          uVar18 = ((uint)(*(int *)(pbVar20 + lVar13 * 4) * -0x3361d2af) >> 0x11 |
                   *(int *)(pbVar20 + lVar13 * 4) * 0x16a88000) * 0x1b873593 ^ uVar18;
          uVar18 = (uVar18 << 0xd | uVar18 >> 0x13) * 5 + 0xe6546b64;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0);
      }
      uVar16 = 0;
      uVar15 = 0;
      switch(uVar7 & 3) {
      case 3:
        uVar15 = (uint)pbVar20[2] << 0x10;
      case 2:
        uVar16 = uVar15 | (uint)pbVar20[1] << 8;
      case 1:
        uVar18 = uVar18 ^ ((*pbVar20 ^ uVar16) * -0x3361d2af >> 0x11 |
                          (*pbVar20 ^ uVar16) * 0x16a88000) * 0x1b873593;
      }
      uVar7 = ((uVar18 ^ uVar7) >> 0x10 ^ uVar18 ^ uVar7) * -0x7a143595;
      uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
      ppfVar11 = v_hashmap<substring,_features_*>::get
                           (ppvVar10[uVar19],&local_40,(ulong)(uVar7 >> 0x10 ^ uVar7));
      pfVar5 = *ppfVar11;
      if (pfVar5 != (features *)0x0) {
        _begin_00 = (pfVar5->values)._begin;
        pfVar12 = (pfVar5->values)._end;
        if (pfVar12 != _begin_00) {
          peVar4 = this->ae;
          if ((peVar4->super_example_predict).feature_space[0x87].values._end ==
              (peVar4->super_example_predict).feature_space[0x87].values._begin) {
            v_array<unsigned_char>::push_back
                      ((v_array<unsigned_char> *)peVar4,&dictionary_namespace);
            _begin_00 = (pfVar5->values)._begin;
            pfVar12 = (pfVar5->values)._end;
          }
          push_many<float>(&(peVar4->super_example_predict).feature_space[0x87].values,_begin_00,
                           (long)pfVar12 - (long)_begin_00 >> 2);
          _begin = (pfVar5->indicies)._begin;
          push_many<unsigned_long>
                    (&(peVar4->super_example_predict).feature_space[0x87].indicies,_begin,
                     (long)(pfVar5->indicies)._end - (long)_begin >> 3);
          (peVar4->super_example_predict).feature_space[0x87].sum_feat_sq =
               pfVar5->sum_feat_sq + (peVar4->super_example_predict).feature_space[0x87].sum_feat_sq
          ;
        }
      }
      uVar19 = uVar19 + 1;
      ppvVar10 = this->namespace_dictionaries[this->index].
                 super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)((long)this->namespace_dictionaries[this->index].
                                    super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar10 >> 3
                             ));
  }
  return;
}

Assistant:

inline void maybeFeature()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
    {
      // maybeFeature --> ø
    }
    else
    {
      // maybeFeature --> 'String' FeatureValue
      substring feature_name = read_name();
      v = cur_channel_v * featureValue();
      uint64_t word_hash;
      if (feature_name.end != feature_name.begin)
        word_hash = (p->hasher(feature_name, channel_hash) & parse_mask);
      else
        word_hash = channel_hash + anon++;
      if (v == 0)
        return;  // dont add 0 valued features to list of features
      features& fs = ae->feature_space[index];
      fs.push_back(v, word_hash);
      if (audit)
      {
        v_array<char> feature_v = v_init<char>();
        push_many(feature_v, feature_name.begin, feature_name.end - feature_name.begin);
        feature_v.push_back('\0');
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(base, feature_v.begin())));
        feature_v.delete_v();
      }
      if ((affix_features[index] > 0) && (feature_name.end != feature_name.begin))
      {
        features& affix_fs = ae->feature_space[affix_namespace];
        if (affix_fs.size() == 0)
          ae->indices.push_back(affix_namespace);
        uint64_t affix = affix_features[index];
        while (affix > 0)
        {
          bool is_prefix = affix & 0x1;
          uint64_t len = (affix >> 1) & 0x7;
          substring affix_name = {feature_name.begin, feature_name.end};
          if (affix_name.end > affix_name.begin + len)
          {
            if (is_prefix)
              affix_name.end = affix_name.begin + len;
            else
              affix_name.begin = affix_name.end - len;
          }
          word_hash =
              p->hasher(affix_name, (uint64_t)channel_hash) * (affix_constant + (affix & 0xF) * quadratic_constant);
          affix_fs.push_back(v, word_hash);
          if (audit)
          {
            v_array<char> affix_v = v_init<char>();
            if (index != ' ')
              affix_v.push_back(index);
            affix_v.push_back(is_prefix ? '+' : '-');
            affix_v.push_back('0' + (char)len);
            affix_v.push_back('=');
            push_many(affix_v, affix_name.begin, affix_name.end - affix_name.begin);
            affix_v.push_back('\0');
            affix_fs.space_names.push_back(audit_strings_ptr(new audit_strings("affix", affix_v.begin())));
          }
          affix >>= 4;
        }
      }
      if (spelling_features[index])
      {
        features& spell_fs = ae->feature_space[spelling_namespace];
        if (spell_fs.size() == 0)
          ae->indices.push_back(spelling_namespace);
        // v_array<char> spelling;
        spelling.clear();
        for (char* c = feature_name.begin; c != feature_name.end; ++c)
        {
          char d = 0;
          if ((*c >= '0') && (*c <= '9'))
            d = '0';
          else if ((*c >= 'a') && (*c <= 'z'))
            d = 'a';
          else if ((*c >= 'A') && (*c <= 'Z'))
            d = 'A';
          else if (*c == '.')
            d = '.';
          else
            d = '#';
          // if ((spelling.size() == 0) || (spelling.last() != d))
          spelling.push_back(d);
        }
        substring spelling_ss = {spelling.begin(), spelling.end()};
        uint64_t word_hash = hashstring(spelling_ss, (uint64_t)channel_hash);
        spell_fs.push_back(v, word_hash);
        if (audit)
        {
          v_array<char> spelling_v = v_init<char>();
          if (index != ' ')
          {
            spelling_v.push_back(index);
            spelling_v.push_back('_');
          }
          push_many(spelling_v, spelling_ss.begin, spelling_ss.end - spelling_ss.begin);
          spelling_v.push_back('\0');
          spell_fs.space_names.push_back(audit_strings_ptr(new audit_strings("spelling", spelling_v.begin())));
        }
      }
      if (namespace_dictionaries[index].size() > 0)
      {
        for (size_t dict = 0; dict < namespace_dictionaries[index].size(); dict++)
        {
          feature_dict* map = namespace_dictionaries[index][dict];
          uint64_t hash = uniform_hash(feature_name.begin, feature_name.end - feature_name.begin, quadratic_constant);
          features* feats = map->get(feature_name, hash);
          if ((feats != nullptr) && (feats->values.size() > 0))
          {
            features& dict_fs = ae->feature_space[dictionary_namespace];
            if (dict_fs.size() == 0)
              ae->indices.push_back(dictionary_namespace);
            push_many(dict_fs.values, feats->values.begin(), feats->values.size());
            push_many(dict_fs.indicies, feats->indicies.begin(), feats->indicies.size());
            dict_fs.sum_feat_sq += feats->sum_feat_sq;
            if (audit)
              for (size_t i = 0; i < feats->indicies.size(); ++i)
              {
                uint64_t id = feats->indicies[i];
                stringstream ss;
                ss << index << '_';
                for (char* fc = feature_name.begin; fc != feature_name.end; ++fc) ss << *fc;
                ss << '=' << id;
                dict_fs.space_names.push_back(audit_strings_ptr(new audit_strings("dictionary", ss.str())));
              }
          }
        }
      }
    }
  }